

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O1

int testing_is_uniprocessor(testing t)

{
  _func_void_void_ptr *p_Var1;
  uint uVar2;
  long lVar3;
  closure *pcVar4;
  nsync_time nVar5;
  nsync_atomic_uint32_ state;
  is_uniprocessor_s s [3];
  undefined8 uStack_370;
  double local_368;
  int local_360;
  double local_258;
  int local_250;
  double local_148;
  int local_140;
  
  nsync_mu_lock(&t->base->testing_mu);
  uVar2 = t->base->is_uniprocessor;
  if (uVar2 == 0xffffffff) {
    lVar3 = 8;
    do {
      *(undefined8 *)((long)&uStack_370 + lVar3) = 0;
      *(undefined4 *)((long)&local_368 + lVar3) = 0;
      lVar3 = lVar3 + 0x110;
    } while (lVar3 != 0x338);
    p_Var1 = (_func_void_void_ptr *)((long)&uStack_370 + 4);
    uStack_370._4_4_ = 0;
    pcVar4 = (closure *)malloc(0x20);
    pcVar4->f0 = closure_f0_uniprocessor_check;
    pcVar4[1].f0 = uniprocessor_check;
    pcVar4[2].f0 = p_Var1;
    pcVar4[3].f0 = (_func_void_void_ptr *)&local_368;
    closure_fork(pcVar4);
    nVar5 = nsync_time_ms(100);
    nsync_time_sleep(nVar5);
    uStack_370._4_4_ = 1;
    nVar5 = nsync_time_ms(400);
    nsync_time_sleep(nVar5);
    do {
    } while (local_360 == 0);
    uStack_370._4_4_ = 0;
    pcVar4 = (closure *)malloc(0x20);
    pcVar4->f0 = closure_f0_uniprocessor_check;
    pcVar4[1].f0 = uniprocessor_check;
    pcVar4[2].f0 = p_Var1;
    pcVar4[3].f0 = (_func_void_void_ptr *)&local_258;
    closure_fork(pcVar4);
    pcVar4 = (closure *)malloc(0x20);
    pcVar4->f0 = closure_f0_uniprocessor_check;
    pcVar4[1].f0 = uniprocessor_check;
    pcVar4[2].f0 = p_Var1;
    pcVar4[3].f0 = (_func_void_void_ptr *)&local_148;
    closure_fork(pcVar4);
    nVar5 = nsync_time_ms(100);
    nsync_time_sleep(nVar5);
    uStack_370._4_4_ = 1;
    nVar5 = nsync_time_ms(400);
    nsync_time_sleep(nVar5);
    uStack_370._4_4_ = 2;
    do {
      do {
      } while (local_250 == 0);
    } while (local_140 == 0);
    uVar2 = (uint)((local_258 + local_148) / local_368 < 1.7);
    t->base->is_uniprocessor = uVar2;
  }
  nsync_mu_unlock(&t->base->testing_mu);
  return uVar2;
}

Assistant:

int testing_is_uniprocessor (testing t) {
	int is_uniprocessor;
	nsync_mu_lock (&t->base->testing_mu);
	is_uniprocessor = t->base->is_uniprocessor;
	if (is_uniprocessor == -1) {
		int i;
		struct is_uniprocessor_s s[3];
		nsync_atomic_uint32_ state;
		for (i = 0; i != 3; i++) {
			s[i].count = 0.0;
			s[i].done = 0;
		}

		ATM_STORE_REL (&state, 0);
		closure_fork (closure_uniprocessor_check (&uniprocessor_check, &state, &s[0]));
		nsync_time_sleep (nsync_time_ms (100));
		ATM_STORE_REL (&state, 1);
		nsync_time_sleep (nsync_time_ms (400));
		ATM_STORE_REL (&state, 2);
		while (!ATM_LOAD_ACQ (&s[0].done)) {
		}

		ATM_STORE_REL (&state, 0);
		closure_fork (closure_uniprocessor_check (&uniprocessor_check, &state, &s[1]));
		closure_fork (closure_uniprocessor_check (&uniprocessor_check, &state, &s[2]));
		nsync_time_sleep (nsync_time_ms (100));
		ATM_STORE_REL (&state, 1);
		nsync_time_sleep (nsync_time_ms (400));
		ATM_STORE_REL (&state, 2);
		while (!ATM_LOAD_ACQ (&s[1].done) || !ATM_LOAD_ACQ (&s[2].done)) {
		}
                t->base->is_uniprocessor = ((s[1].count + s[2].count) / s[0].count) < 1.7;
		is_uniprocessor = t->base->is_uniprocessor;
	}
	nsync_mu_unlock (&t->base->testing_mu);
	return (is_uniprocessor);
}